

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profiler_unittest.cc
# Opt level: O2

void Allocate(int start,int end,int size)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  marker = "Allocate";
  uVar3 = 0;
  uVar2 = (ulong)(uint)start;
  if (start < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 8 != uVar3; uVar3 = uVar3 + 8) {
    pvVar1 = operator_new__((ulong)(uint)end << 2);
    *(void **)((long)g_array + uVar3) = pvVar1;
  }
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE void Allocate(int start, int end, int size) {
  // NOTE: we're using this to prevent gcc 5 from merging otherwise
  // identical Allocate & Allocate2 functions.
  marker = "Allocate";
  for (int i = start; i < end; ++i) {
    if (i < kMaxCount)
      g_array[i] = new int[size];
  }
}